

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

void icetDataReplicationGroupColor(IceTInt color)

{
  IceTVoid *recvbuf;
  IceTInt *processes;
  long lVar1;
  IceTInt size;
  IceTInt num_proc;
  IceTInt color_local;
  
  color_local = color;
  icetGetIntegerv(3,&num_proc);
  recvbuf = icetGetStateBuffer(0x1a0,num_proc << 2);
  processes = (IceTInt *)icetGetStateBuffer(0x1a1,num_proc << 2);
  icetCommAllgather(&color_local,1,0x8003,recvbuf);
  size = 0;
  for (lVar1 = 0; lVar1 < num_proc; lVar1 = lVar1 + 1) {
    if (*(int *)((long)recvbuf + lVar1 * 4) == color_local) {
      processes[size] = (IceTInt)lVar1;
      size = size + 1;
    }
  }
  icetDataReplicationGroup(size,processes);
  return;
}

Assistant:

void icetDataReplicationGroupColor(IceTInt color)
{
    IceTInt *allcolors;
    IceTInt *mygroup;
    IceTInt num_proc;
    IceTInt i;
    IceTInt size;

    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    /* Just grab two buffers that should be not be used now.  We will be
       done with them by the time we return from this function. */
    allcolors = icetGetStateBuffer(ICET_STRATEGY_BUFFER_0,
                                   sizeof(IceTInt)*num_proc);
    mygroup = icetGetStateBuffer(ICET_STRATEGY_BUFFER_1,
                                 sizeof(IceTInt)*num_proc);

    icetCommAllgather(&color, 1, ICET_INT, allcolors);

    size = 0;
    for (i = 0; i < num_proc; i++) {
        if (allcolors[i] == color) {
            mygroup[size] = i;
            size++;
        }
    }

    icetDataReplicationGroup(size, mygroup);
}